

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

void __thiscall
Test::Suite::testRun
          (Suite *this,bool success,char *fileName,uint32_t lineNumber,string *errorMessage,
          string *userMessage)

{
  bool bVar1;
  AssertionFailedException *this_00;
  Assertion local_1d8;
  Assertion local_100;
  string *local_38;
  string *userMessage_local;
  string *errorMessage_local;
  char *pcStack_20;
  uint32_t lineNumber_local;
  char *fileName_local;
  Suite *pSStack_10;
  bool success_local;
  Suite *this_local;
  
  local_38 = userMessage;
  userMessage_local = errorMessage;
  errorMessage_local._4_4_ = lineNumber;
  pcStack_20 = fileName;
  fileName_local._7_1_ = success;
  pSStack_10 = this;
  if (success) {
    Assertion::Assertion(&local_1d8,fileName,lineNumber);
    testSucceeded(this,&local_1d8);
    Assertion::~Assertion(&local_1d8);
  }
  else {
    Assertion::Assertion(&local_100,fileName,lineNumber,errorMessage,userMessage);
    testFailed(this,&local_100);
    Assertion::~Assertion(&local_100);
    bVar1 = continueAfterFailure(this);
    if (!bVar1) {
      this_00 = (AssertionFailedException *)__cxa_allocate_exception(0x10);
      AssertionFailedException::AssertionFailedException(this_00);
      __cxa_throw(this_00,&AssertionFailedException::typeinfo,
                  AssertionFailedException::~AssertionFailedException);
    }
  }
  return;
}

Assistant:

void Suite::testRun(
    bool success, const char *fileName, uint32_t lineNumber, std::string &&errorMessage, const std::string &userMessage) {
  if (!success) {
    testFailed(Assertion(fileName, lineNumber, errorMessage, userMessage));
    if (!continueAfterFailure())
      throw AssertionFailedException{};
  } else
    testSucceeded(Assertion(fileName, lineNumber));
}